

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

void write_file_u32(vector<unsigned_int,_std::allocator<unsigned_int>_> *nums,string *file_name)

{
  pointer pcVar1;
  pointer __ptr;
  int iVar2;
  FILE *__s;
  size_t sVar3;
  string local_40;
  
  pcVar1 = (file_name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + file_name->_M_string_length);
  __s = (FILE *)fopen_or_fail(&local_40,"wb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  __ptr = (nums->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start;
  sVar3 = fwrite(__ptr,4,(long)(nums->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)__ptr >> 2,__s);
  if (sVar3 == (long)(nums->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(nums->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_start >> 2) {
    iVar2 = fclose(__s);
    if (iVar2 == 0) {
      return;
    }
    quit("closing file failed");
  }
  quit("reading file content failed: %d",sVar3);
}

Assistant:

void write_file_u32(std::vector<uint32_t>& nums, std::string file_name)
{
    auto f = fopen_or_fail(file_name, "wb");
    auto ret = fwrite(nums.data(), sizeof(uint32_t), nums.size(), f);
    if (ret != nums.size()) {
        quit("reading file content failed: %d", ret);
    }
    fclose_or_fail(f);
}